

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator=(BN *this,BN *bn)

{
  if (this != bn) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign(&this->ba);
  }
  return this;
}

Assistant:

BN & BN::operator = (BN&& bn) noexcept
{
    if (this == &bn)
        return *this;
    ba = move(bn.ba);

    return *this;
}